

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Path * kj::Path::parse(Path *__return_storage_ptr__,StringPtr path)

{
  bool bVar1;
  size_t sVar2;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  char *in_R8;
  StringPtr path_00;
  StringPtr path_01;
  Vector<kj::String> local_68;
  Fault local_38;
  Fault f;
  undefined1 auStack_20 [8];
  StringPtr path_local;
  
  path_local.content.ptr = (char *)path.content.size_;
  auStack_20 = (undefined1  [8])path.content.ptr;
  path_local.content.size_ = (size_t)__return_storage_ptr__;
  StringPtr::StringPtr((StringPtr *)&f,"/");
  bVar1 = StringPtr::startsWith((StringPtr *)auStack_20,(StringPtr *)&f);
  sVar2 = extraout_RDX;
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    in_R8 = "!path.startsWith(\"/\")";
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39],kj::StringPtr&>
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x35,FAILED,"!path.startsWith(\"/\")",
               "\"expected a relative path, got absolute\", path",
               (char (*) [39])"expected a relative path, got absolute",(StringPtr *)auStack_20);
    kj::_::Debug::Fault::~Fault(&local_38);
    sVar2 = extraout_RDX_00;
  }
  path_01.content.size_ = sVar2;
  path_01.content.ptr = path_local.content.ptr;
  sVar2 = countParts((Path *)auStack_20,path_01);
  Vector<kj::String>::Vector(&local_68,sVar2);
  path_00.content.size_ = (size_t)in_R8;
  path_00.content.ptr = path_local.content.ptr;
  evalImpl(__return_storage_ptr__,(Path *)&local_68,(Vector<kj::String> *)auStack_20,path_00);
  Vector<kj::String>::~Vector(&local_68);
  return __return_storage_ptr__;
}

Assistant:

Path Path::parse(StringPtr path) {
  KJ_REQUIRE(!path.startsWith("/"), "expected a relative path, got absolute", path) {
    // When exceptions are disabled, go on -- the leading '/' will end up ignored.
    break;
  }
  return evalImpl(Vector<String>(countParts(path)), path);
}